

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mon-init.c
# Opt level: O0

parser_error parse_monster_shape(parser *p)

{
  void *pvVar1;
  undefined8 *puVar2;
  char *pcVar3;
  monster_base *pmVar4;
  monster_shape *s;
  monster_race *r;
  parser *p_local;
  
  pvVar1 = parser_priv(p);
  if (pvVar1 == (void *)0x0) {
    p_local._4_4_ = PARSE_ERROR_MISSING_RECORD_HEADER;
  }
  else {
    puVar2 = (undefined8 *)mem_zalloc(0x20);
    pcVar3 = parser_getstr(p,"name");
    pcVar3 = string_make(pcVar3);
    puVar2[1] = pcVar3;
    pmVar4 = lookup_monster_base((char *)puVar2[1]);
    puVar2[3] = pmVar4;
    *puVar2 = *(undefined8 *)((long)pvVar1 + 0xc0);
    *(undefined8 **)((long)pvVar1 + 0xc0) = puVar2;
    *(int *)((long)pvVar1 + 200) = *(int *)((long)pvVar1 + 200) + 1;
    p_local._4_4_ = PARSE_ERROR_NONE;
  }
  return p_local._4_4_;
}

Assistant:

static enum parser_error parse_monster_shape(struct parser *p) {
	struct monster_race *r = parser_priv(p);
	struct monster_shape *s;

	if (!r)
		return PARSE_ERROR_MISSING_RECORD_HEADER;
	s = mem_zalloc(sizeof *s);
	s->name = string_make(parser_getstr(p, "name"));
	s->base = lookup_monster_base(s->name);
	s->next = r->shapes;
	r->shapes = s;
	r->num_shapes++;

	return PARSE_ERROR_NONE;
}